

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

adj_list *
get_adj(adj_list *__return_storage_ptr__,int nv,vector<Arc,_std::allocator<Arc>_> *arcs,
       bool transpose)

{
  int iVar1;
  int iVar2;
  pointer pAVar3;
  pointer pvVar4;
  runtime_error *this;
  iterator __position;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  int *piVar5;
  pointer pAVar6;
  char _error_msg_ [256];
  pair<int,_int> local_138 [33];
  
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)nv,(allocator_type *)local_138);
  pAVar6 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar3 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pAVar6 != pAVar3) {
    piVar5 = &pAVar6->label;
    do {
      iVar1 = ((Arc *)(piVar5 + -2))->u;
      if ((nv <= iVar1) || (iVar2 = piVar5[-1], nv <= iVar2)) {
        snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "a.u < nv && a.v < nv",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/graph.cpp"
                 ,0x49);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,(char *)local_138);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar4 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (transpose) {
        this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)(pvVar4 + iVar2);
        local_138[0].second = *piVar5;
        local_138[0].first = iVar1;
        __position._M_current = *(pair<int,_int> **)(this_00 + 8);
        if (__position._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>(this_00,__position,local_138);
        }
        else {
LAB_001077dd:
          *__position._M_current = local_138[0];
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      else {
        this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)(pvVar4 + iVar1);
        local_138[0].second = *piVar5;
        local_138[0].first = iVar2;
        __position._M_current = *(pair<int,_int> **)(this_00 + 8);
        if (__position._M_current != *(pair<int,_int> **)(this_00 + 0x10)) goto LAB_001077dd;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(this_00,__position,local_138);
      }
      pAVar6 = (pointer)(piVar5 + 1);
      piVar5 = piVar5 + 3;
    } while (pAVar6 != pAVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

adj_list get_adj(int nv, const std::vector<Arc> &arcs, bool transpose) {
	adj_list adj(nv);
	for (const Arc &a : arcs) {
		throw_assert(a.u < nv && a.v < nv);
		if (!transpose) {
			adj[a.u].push_back(MP(a.v, a.label));
		} else {
			adj[a.v].push_back(MP(a.u, a.label));
		}
	}
	return adj;
}